

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

AmpIO * SelectBoard(string *portName,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList,
                   AmpIO *curBoard)

{
  pointer ppAVar1;
  int iVar2;
  ostream *poVar3;
  AmpIO *pAVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  pAVar4 = curBoard;
  if (8 < (ulong)((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                       super__Vector_impl_data._M_start)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Select ");
    poVar3 = std::operator<<(poVar3,(string *)portName);
    std::operator<<(poVar3," Board: ");
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3," ");
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"(any other key to keep current board ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::operator<<(poVar3,")");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = getchar();
    uVar5 = iVar2 - 0x30U;
    if (9 < iVar2 - 0x30U) {
      if (iVar2 - 0x61U < 6) {
        uVar5 = iVar2 - 0x57;
      }
      else {
        uVar5 = 0xffffffff;
        if (iVar2 - 0x41U < 6) {
          uVar5 = iVar2 - 0x37;
        }
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (-1 < (int)uVar5) {
      ppAVar1 = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        if ((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3 == lVar6) {
          return curBoard;
        }
        pAVar4 = ppAVar1[lVar6];
        lVar6 = lVar6 + 1;
      } while (uVar5 != (pAVar4->super_FpgaIO).super_BoardIO.BoardId);
    }
  }
  return pAVar4;
}

Assistant:

AmpIO *SelectBoard(const std::string &portName, std::vector<AmpIO *> boardList, AmpIO *curBoard)
{
    AmpIO *newBoard = curBoard;
    if (boardList.size() > 1) {
        size_t i;
        std::cout << "Select " << portName << " Board: ";
        for (i = 0; i < boardList.size(); i++)
            std::cout << std::hex << static_cast<unsigned int>(boardList[i]->GetBoardId()) << " ";
        std::cout << "(any other key to keep current board " << std::hex << static_cast<unsigned int>(curBoard->GetBoardId())
                  << std::dec << ")" << std::endl;
        int num = getchar();
        if ((num >= '0') && (num <= '9')) num -= '0';
        else if ((num >= 'a') && (num <= 'f')) num = 10 + (num - 'a');
        else if ((num >= 'A') && (num <= 'F')) num = 10 + (num - 'A');
        else num = -1;
        std::cout << std::endl;
        if (num >= 0) {
            for (i = 0; i < boardList.size(); i++) {
                if (num == boardList[i]->GetBoardId()) {
                    newBoard = boardList[i];
                    break;
                }
            }
        }
    }
    return newBoard;
}